

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring blk2bstr(void *blk,int len)

{
  uint uVar1;
  bstring __ptr;
  uchar *__dest;
  uint uVar2;
  
  if (-1 < len && blk != (void *)0x0) {
    __ptr = (bstring)malloc(0x10);
    if (__ptr != (bstring)0x0) {
      __ptr->slen = len;
      uVar1 = len + 1 + (uint)(len == 0);
      uVar2 = 8;
      if ((7 < (int)uVar1) &&
         (uVar2 = uVar1 >> 1 | uVar1, uVar2 = uVar2 >> 2 | uVar2, uVar2 = uVar2 >> 4 | uVar2,
         uVar2 = uVar2 >> 8 | uVar2, uVar2 = (uVar2 >> 0x10 | uVar2) + 1, (int)uVar2 <= (int)uVar1))
      {
        uVar2 = uVar1;
      }
      __ptr->mlen = uVar2;
      __dest = (uchar *)malloc((ulong)uVar2);
      __ptr->data = __dest;
      if (__dest != (uchar *)0x0) {
        if (0 < len) {
          memcpy(__dest,blk,(ulong)(uint)len);
        }
        __dest[(uint)len] = '\0';
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring blk2bstr (const void * blk, int len) {
bstring b;
int i;

	if (blk == NULL || len < 0) return NULL;
	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL;
	b->slen = len;

	i = len + (2 - (len != 0));
	i = snapUpSize (i);

	b->mlen = i;

	b->data = (unsigned char *) bstr__alloc (b->mlen);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	if (len > 0) bstr__memcpy (b->data, blk, len);
	b->data[len] = (unsigned char) '\0';

	return b;
}